

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O1

void __thiscall wasm::Thread::Thread(Thread *this,ThreadPool *parent)

{
  thread *this_00;
  Thread *local_38;
  
  this->parent = parent;
  (this->thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>._M_t.
  super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
  super__Head_base<0UL,_std::thread_*,_false>._M_head_impl = (thread *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mutex).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::condition_variable::condition_variable(&this->condition);
  this->done = false;
  *(undefined8 *)&(this->doWork).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->doWork).super__Function_base._M_functor + 8) = 0;
  (this->doWork).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->doWork)._M_invoker = (_Invoker_type)0x0;
  if (parent->running != true) {
    local_38 = this;
    this_00 = (thread *)operator_new(8);
    std::thread::thread<void(&)(void*),wasm::Thread*,void>(this_00,mainLoop,&local_38);
    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&this->thread,
               this_00);
    return;
  }
  __assert_fail("!parent->isRunning()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/threads.cpp"
                ,0x33,"wasm::Thread::Thread(ThreadPool *)");
}

Assistant:

Thread::Thread(ThreadPool* parent) : parent(parent) {
  assert(!parent->isRunning());
  thread = std::make_unique<std::thread>(mainLoop, this);
}